

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

quaternion * quaternion_rotate_by_axis_angle_EXP(quaternion *self,vector3 *axis,double angle)

{
  undefined1 local_40 [8];
  quaternion qT;
  double angle_local;
  vector3 *axis_local;
  quaternion *self_local;
  
  qT.field_0.q[3] = angle;
  quaternion_set_from_axis_anglev3((quaternion *)local_40,axis,angle);
  quaternion_rotate_by_quaternion_EXP(self,(quaternion *)local_40);
  return self;
}

Assistant:

HYPAPI struct quaternion *quaternion_rotate_by_axis_angle_EXP(struct quaternion *self, const struct vector3 *axis, HYP_FLOAT angle)
{
	struct quaternion qT;

	quaternion_set_from_axis_anglev3(&qT, axis, angle);
	quaternion_rotate_by_quaternion_EXP(self, &qT);

	return self;
}